

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeysTool.cpp
# Opt level: O3

void createToken(path *keyFile)

{
  ostream *poVar1;
  runtime_error *prVar2;
  size_t in_R8;
  ulong uVar3;
  string tokenStr;
  optional<jbcoin::ValidatorToken> token;
  ValidatorKeys keys;
  string local_118;
  long *local_f8;
  long local_f0;
  long local_e8 [2];
  optional_base<jbcoin::ValidatorToken> local_d8;
  ValidatorKeys local_90;
  
  jbcoin::ValidatorKeys::make_ValidatorKeys(&local_90,keyFile);
  if (local_90.revoked_ == true) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Validator keys have been revoked.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_118._M_dataplus._M_p._0_4_ = 0;
  jbcoin::ValidatorKeys::createValidatorToken
            ((optional<jbcoin::ValidatorToken> *)&local_d8,&local_90,(KeyType *)&local_118);
  if (local_d8.m_initialized != false) {
    jbcoin::ValidatorKeys::writeToFile(&local_90,keyFile);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Update jbcoind.cfg file with these values and restart jbcoind:\n\n",0x40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"# validator public key: ",0x18);
    jbcoin::base58EncodeToken_abi_cxx11_
              (&local_118,(jbcoin *)0x1c,(char)&local_90 + '\x10',(void *)local_90.publicKey_.size_,
               in_R8);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        (char *)CONCAT44(local_118._M_dataplus._M_p._4_4_,
                                         local_118._M_dataplus._M_p._0_4_),
                        local_118._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_118._M_dataplus._M_p._4_4_,local_118._M_dataplus._M_p._0_4_) !=
        &local_118.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_118._M_dataplus._M_p._4_4_,local_118._M_dataplus._M_p._0_4_),
                      local_118.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[validator_token]\n",0x12);
    if (local_d8.m_initialized != false) {
      jbcoin::ValidatorToken::toString_abi_cxx11_(&local_118,(ValidatorToken *)&local_d8.m_storage);
      if (local_118._M_string_length != 0) {
        uVar3 = 0;
        do {
          std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_118);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_f8,local_f0);
          std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          if (local_f8 != local_e8) {
            operator_delete(local_f8,local_e8[0] + 1);
          }
          uVar3 = uVar3 + 0x48;
        } while (uVar3 < local_118._M_string_length);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_118._M_dataplus._M_p._4_4_,local_118._M_dataplus._M_p._0_4_) !=
          &local_118.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_118._M_dataplus._M_p._4_4_,local_118._M_dataplus._M_p._0_4_),
                        local_118.field_2._M_allocated_capacity + 1);
      }
      boost::optional_detail::optional_base<jbcoin::ValidatorToken>::~optional_base(&local_d8);
      jbcoin::SecretKey::~SecretKey(&local_90.secretKey_);
      return;
    }
    __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c5,
                  "pointer_const_type boost::optional<jbcoin::ValidatorToken>::operator->() const [T = jbcoin::ValidatorToken]"
                 );
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (prVar2,
             "Maximum number of tokens have already been generated.\nRevoke validator keys if previous token has been compromised."
            );
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void createToken (boost::filesystem::path const& keyFile)
{
    using namespace jbcoin;

    auto keys = ValidatorKeys::make_ValidatorKeys (keyFile);

    if (keys.revoked ())
        throw std::runtime_error (
            "Validator keys have been revoked.");

    auto const token = keys.createValidatorToken ();

    if (! token)
        throw std::runtime_error (
            "Maximum number of tokens have already been generated.\n"
            "Revoke validator keys if previous token has been compromised.");

    // Update key file with new token sequence
    keys.writeToFile (keyFile);

    std::cout << "Update jbcoind.cfg file with these values and restart jbcoind:\n\n";
    std::cout << "# validator public key: " <<
        toBase58 (TOKEN_NODE_PUBLIC, keys.publicKey()) << "\n\n";
    std::cout << "[validator_token]\n";

    auto const tokenStr = token->toString();
    auto const len = 72;
    for (auto i = 0; i < tokenStr.size(); i += len)
        std::cout << tokenStr.substr(i, len) << std::endl;

    std::cout << std::endl;
}